

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::Sampler(ParsedScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  FileLoc loc_00;
  size_t sVar1;
  char *pcVar2;
  ParsedParameterVector *in_RDI;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_fffffffffffffda8;
  Tuple2<pbrt::Point2,_float> TVar3;
  ParameterDictionary *in_stack_fffffffffffffdb0;
  Tuple2<pbrt::Point2,_float> this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffdb8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffdc0;
  RGBColorSpace *colorSpace;
  SceneEntity *this_01;
  char *in_stack_fffffffffffffde8;
  FileLoc *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe00;
  SceneEntity local_e0;
  
  colorSpace = (RGBColorSpace *)&stack0x00000008;
  this_01 = &local_e0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  ParameterDictionary::ParameterDictionary((ParameterDictionary *)this_01,in_RDI,colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffdb0->params);
  if (*(int *)((long)&in_RDI[0x16].field_2 + 0x10) == 2) {
    Error<char_const(&)[8]>
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(char (*) [8])this_01);
  }
  else if (*(int *)((long)&in_RDI[0x16].field_2 + 0x10) == 1) {
    Error<char_const(&)[8]>
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(char (*) [8])this_01);
  }
  else {
    ParameterDictionary::ParameterDictionary(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    TVar3 = (colorSpace->r).super_Tuple2<pbrt::Point2,_float>;
    this_00 = (colorSpace->g).super_Tuple2<pbrt::Point2,_float>;
    sVar1 = *(size_t *)&colorSpace->g;
    pcVar2 = *(char **)&colorSpace->b;
    loc_00.filename._M_str = pcVar2;
    loc_00.filename._M_len = sVar1;
    loc_00.line = (int)in_stack_fffffffffffffe00;
    loc_00.column = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    SceneEntity::SceneEntity(this_01,(string *)in_RDI,(ParameterDictionary *)colorSpace,loc_00);
    SceneEntity::operator=((SceneEntity *)this_00,(SceneEntity *)TVar3);
    SceneEntity::~SceneEntity((SceneEntity *)this_00);
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x67adc9);
  }
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x67ade1);
  return;
}

Assistant:

void ParsedScene::Sampler(const std::string &name, ParsedParameterVector params,
                          FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState->colorSpace);

    VERIFY_OPTIONS("Sampler");
    sampler = SceneEntity(name, std::move(dict), loc);
}